

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::BitwiseXor(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                     uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
                     uint32_t width,uint32_t height,SIMDType simdType)

{
  uchar *puVar1;
  uint *puVar2;
  byte *pbVar3;
  uchar *puVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  SIMDType SVar12;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  byte *pbVar13;
  uchar *puVar14;
  byte *pbVar15;
  undefined4 in_register_0000008c;
  uint uVar16;
  uint uVar17;
  uchar *puVar18;
  uchar *puVar19;
  long lVar20;
  byte *pbVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  uint local_cc;
  uint32_t local_b0;
  uint local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong local_90;
  Image *local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_a0 = CONCAT44(in_register_0000008c,startY2);
  local_a8 = CONCAT44(in_register_00000014,startY1);
  local_98 = (ulong)height;
  local_90 = (ulong)startYOut;
  do {
    SVar12 = simdType;
    bVar11 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                       (in1,in2,out);
    local_b0 = (uint32_t)local_98;
    if (SVar12 != avx_function) {
      if (SVar12 - sse_function < 2) {
        local_cc = 0x10;
        if (0xf < bVar11 * width) goto LAB_00130b89;
      }
      else if (SVar12 != cpu_function) {
        local_cc = 0;
        goto LAB_00130b89;
      }
      Image_Function::BitwiseXor
                (in1,startX1,(uint32_t)local_a8,in2,startX2,(uint32_t)local_a0,out,startXOut,
                 startYOut,width,height);
      return;
    }
    simdType = sse_function;
  } while (bVar11 * width < 0x20);
  local_cc = 0x20;
LAB_00130b89:
  uVar16 = (uint)bVar11;
  local_88 = in1;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,(uint32_t)local_a8,in2,startX2,(uint32_t)local_a0,out,startXOut,
             (uint32_t)local_90,width,local_b0);
  local_ac = width * uVar16;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_ac,&local_b0,local_88,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar6 = in1->_rowSize;
  uVar7 = in2->_rowSize;
  uVar8 = out->_rowSize;
  uVar17 = local_b0 * uVar8;
  puVar19 = in1->_data + (ulong)(startX1 * uVar16) + (ulong)((int)local_a8 * uVar6);
  uVar9 = (ulong)local_ac / (ulong)local_cc;
  uVar10 = (ulong)local_ac % (ulong)local_cc;
  puVar18 = out->_data + (ulong)(startXOut * uVar16) + (ulong)((int)local_90 * uVar8);
  puVar14 = in2->_data + (ulong)(startX2 * uVar16) + (ulong)((int)local_a0 * uVar7);
  puVar1 = puVar18 + uVar17;
  uVar16 = (int)uVar9 * local_cc;
  if (SVar12 == sse_function) {
    if (uVar17 != 0) {
      do {
        if (local_cc <= local_ac) {
          lVar20 = 0;
          do {
            puVar4 = puVar19 + lVar20 + 0x10;
            puVar2 = (uint *)(puVar14 + lVar20);
            auVar22._0_4_ = *puVar2 ^ *(uint *)(puVar4 + -0x10);
            auVar22._4_4_ = puVar2[1] ^ *(uint *)(puVar4 + -0xc);
            auVar22._8_4_ = puVar2[2] ^ *(uint *)(puVar4 + -8);
            auVar22._12_4_ = puVar2[3] ^ *(uint *)(puVar4 + -4);
            *(undefined1 (*) [16])(puVar18 + lVar20) = auVar22;
            lVar20 = lVar20 + 0x10;
          } while (puVar4 != puVar19 + uVar9 * 0x10);
        }
        if (local_ac != uVar16) {
          pbVar21 = puVar18 + uVar16;
          pbVar15 = puVar14 + uVar16;
          pbVar13 = puVar19 + uVar16;
          pbVar3 = pbVar21 + uVar10;
          do {
            bVar11 = *pbVar15;
            pbVar15 = pbVar15 + 1;
            bVar5 = *pbVar13;
            pbVar13 = pbVar13 + 1;
            *pbVar21 = bVar11 ^ bVar5;
            pbVar21 = pbVar21 + 1;
          } while (pbVar21 != pbVar3);
        }
        puVar18 = puVar18 + uVar8;
        puVar19 = puVar19 + uVar6;
        puVar14 = puVar14 + uVar7;
      } while (puVar18 != puVar1);
    }
  }
  else if ((SVar12 == avx_function) && (uVar17 != 0)) {
    do {
      if (local_cc <= local_ac) {
        lVar20 = 0;
        do {
          puVar4 = puVar19 + lVar20 + 0x20;
          puVar2 = (uint *)(puVar14 + lVar20);
          auVar23._0_4_ = *puVar2 ^ *(uint *)(puVar4 + -0x20);
          auVar23._4_4_ = puVar2[1] ^ *(uint *)(puVar4 + -0x1c);
          auVar23._8_4_ = puVar2[2] ^ *(uint *)(puVar4 + -0x18);
          auVar23._12_4_ = puVar2[3] ^ *(uint *)(puVar4 + -0x14);
          auVar23._16_4_ = puVar2[4] ^ *(uint *)(puVar4 + -0x10);
          auVar23._20_4_ = puVar2[5] ^ *(uint *)(puVar4 + -0xc);
          auVar23._24_4_ = puVar2[6] ^ *(uint *)(puVar4 + -8);
          auVar23._28_4_ = puVar2[7] ^ *(uint *)(puVar4 + -4);
          *(undefined1 (*) [32])(puVar18 + lVar20) = auVar23;
          lVar20 = lVar20 + 0x20;
        } while (puVar4 != puVar19 + uVar9 * 0x20);
      }
      if (local_ac != uVar16) {
        pbVar21 = puVar18 + uVar16;
        pbVar15 = puVar14 + uVar16;
        pbVar13 = puVar19 + uVar16;
        pbVar3 = pbVar21 + uVar10;
        do {
          bVar11 = *pbVar15;
          pbVar15 = pbVar15 + 1;
          bVar5 = *pbVar13;
          pbVar13 = pbVar13 + 1;
          *pbVar21 = bVar11 ^ bVar5;
          pbVar21 = pbVar21 + 1;
        } while (pbVar21 != pbVar3);
      }
      puVar18 = puVar18 + uVar8;
      puVar19 = puVar19 + uVar6;
      puVar14 = puVar14 + uVar7;
    } while (puVar18 != puVar1);
  }
  return;
}

Assistant:

void BitwiseXor( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                     Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( BitwiseXor( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::BitwiseXor( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::BitwiseXor( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::BitwiseXor( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::BitwiseXor( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }